

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::LegacyScriptPubKeyMan::RemoveWatchOnly(LegacyScriptPubKeyMan *this,CScript *dest)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock27;
  CKeyID local_7c;
  CPubKey pubKey;
  long *plVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock27,
             &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore,"cs_KeyStore",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x38d,false);
  std::
  _Rb_tree<CScript,_CScript,_std::_Identity<CScript>,_std::less<CScript>,_std::allocator<CScript>_>
  ::erase(&(this->super_LegacyDataSPKM).setWatchOnly._M_t,dest);
  pubKey.vch[0] = 0xff;
  bVar2 = ExtractPubKey(dest,&pubKey);
  if (bVar2) {
    CPubKey::GetID(&local_7c,&pubKey);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
    ::erase(&(this->super_LegacyDataSPKM).mapWatchKeys._M_t,&local_7c);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock27.super_unique_lock);
  bVar2 = LegacyDataSPKM::HaveWatchOnly(&this->super_LegacyDataSPKM);
  if (!bVar2) {
    boost::signals2::
    signal<void_(bool),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(bool)>,_boost::function<void_(const_boost::signals2::connection_&,_bool)>,_boost::signals2::mutex>
    ::operator()(&(this->super_LegacyDataSPKM).super_ScriptPubKeyMan.NotifyWatchonlyChanged,false);
  }
  iVar3 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])
                    ();
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  (**(code **)(*plVar4 + 0x70))((WalletBatch *)&pubKey,plVar4,1);
  pubKey.vch._8_8_ = plVar4;
  bVar2 = WalletBatch::EraseWatchOnly((WalletBatch *)&pubKey,dest);
  if ((long *)CONCAT71(pubKey.vch._1_7_,pubKey.vch[0]) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(pubKey.vch._1_7_,pubKey.vch[0]) + 0x28))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::RemoveWatchOnly(const CScript &dest)
{
    {
        LOCK(cs_KeyStore);
        setWatchOnly.erase(dest);
        CPubKey pubKey;
        if (ExtractPubKey(dest, pubKey)) {
            mapWatchKeys.erase(pubKey.GetID());
        }
        // Related CScripts are not removed; having superfluous scripts around is
        // harmless (see comment in ImplicitlyLearnRelatedKeyScripts).
    }

    if (!HaveWatchOnly())
        NotifyWatchonlyChanged(false);
    if (!WalletBatch(m_storage.GetDatabase()).EraseWatchOnly(dest))
        return false;

    return true;
}